

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O1

bool booster::locale::gnu_gettext::mo_file::key_equals(char *real_key,char *cntx,char *key)

{
  int iVar1;
  size_t sVar2;
  size_t __n;
  size_t __n_00;
  bool bVar3;
  
  if (cntx == (char *)0x0) {
    iVar1 = strcmp(real_key,key);
LAB_00177f81:
    bVar3 = iVar1 == 0;
  }
  else {
    sVar2 = strlen(real_key);
    __n = strlen(cntx);
    __n_00 = strlen(key);
    if (__n_00 + __n + 1 == sVar2) {
      iVar1 = bcmp(real_key,cntx,__n);
      if ((iVar1 == 0) && (real_key[__n] == '\x04')) {
        iVar1 = bcmp(real_key + __n + 1,key,__n_00);
        goto LAB_00177f81;
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool key_equals(char const *real_key,char const *cntx,char const *key)
                {
                    if(cntx == 0)
                        return strcmp(real_key,key) == 0;
                    else {
                        size_t real_len = strlen(real_key);
                        size_t cntx_len = strlen(cntx);
                        size_t key_len = strlen(key);
                        if(cntx_len + 1 + key_len != real_len)
                            return false;
                        return 
                            memcmp(real_key,cntx,cntx_len) == 0
                            && real_key[cntx_len] == '\4'
                            && memcmp(real_key + cntx_len + 1 ,key,key_len) == 0;
                    }
                }